

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O3

void calc_mean_and_sd_<double,unsigned_long,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,double *x_sd,double *x_mean)

{
  ulong *puVar1;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  unsigned_long uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong *puVar12;
  longdouble in_ST0;
  longdouble lVar13;
  longdouble lVar14;
  longdouble in_ST1;
  longdouble lVar15;
  longdouble lVar16;
  double dVar17;
  ulong local_a8;
  
  uVar7 = Xc_indptr[col_num];
  uVar2 = Xc_indptr[col_num + 1];
  if (uVar7 == uVar2) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  puVar12 = ix_arr + st;
  puVar11 = ix_arr + end + 1;
  uVar3 = (long)puVar11 - (long)puVar12 >> 3;
  if (0 < (long)uVar3) {
    do {
      uVar4 = uVar3 >> 1;
      uVar10 = ~uVar4 + uVar3;
      uVar3 = uVar4;
      if ((puVar12 + uVar4 + 1)[-1] < Xc_ind[uVar7]) {
        puVar12 = puVar12 + uVar4 + 1;
        uVar3 = uVar10;
      }
    } while (0 < (long)uVar3);
  }
  if (puVar12 != puVar11) {
    uVar3 = Xc_ind[uVar2 - 1];
    local_a8 = (end - st) + 1;
    lVar15 = (longdouble)0;
    uVar4 = 0;
    lVar16 = lVar15;
    while (uVar10 = *puVar12, uVar10 <= uVar3) {
      puVar1 = Xc_ind + uVar7;
      uVar5 = *puVar1;
      if (uVar5 == uVar10) {
        if ((ulong)ABS(Xc[uVar7]) < 0x7ff0000000000000) {
          uVar4 = uVar4 + 1;
          lVar15 = ((longdouble)Xc[uVar7] - lVar15) /
                   ((longdouble)(long)uVar4 + (longdouble)(float)(&DAT_0036e0d8)[(long)uVar4 < 0]) +
                   lVar15;
          lVar13 = in_ST1;
          fmal();
          lVar16 = in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = lVar13;
        }
        else {
          local_a8 = local_a8 - 1;
        }
        if ((puVar12 == ix_arr + end) || (uVar7 == uVar2 - 1)) break;
        puVar6 = puVar1 + 1;
        puVar12 = puVar12 + 1;
        uVar10 = (long)((long)Xc_ind + (uVar2 * 8 - (long)puVar6)) >> 3;
        if (0 < (long)uVar10) {
          do {
            uVar5 = uVar10 >> 1;
            uVar8 = ~uVar5 + uVar10;
            uVar10 = uVar5;
            if (puVar6[uVar5] < *puVar12) {
              puVar6 = puVar6 + uVar5 + 1;
              uVar10 = uVar8;
            }
          } while (0 < (long)uVar10);
        }
LAB_0023ee64:
        uVar7 = (long)puVar6 - (long)Xc_ind >> 3;
      }
      else {
        if (uVar5 <= uVar10) {
          puVar6 = puVar1 + 1;
          uVar5 = (long)((long)Xc_ind + (uVar2 * 8 - (long)(puVar1 + 1))) >> 3;
          while (0 < (long)uVar5) {
            uVar8 = uVar5 >> 1;
            uVar9 = ~uVar8 + uVar5;
            uVar5 = uVar8;
            if (puVar6[uVar8] < uVar10) {
              puVar6 = puVar6 + uVar8 + 1;
              uVar5 = uVar9;
            }
          }
          goto LAB_0023ee64;
        }
        puVar12 = puVar12 + 1;
        uVar10 = (long)puVar11 - (long)puVar12 >> 3;
        while (0 < (long)uVar10) {
          uVar8 = uVar10 >> 1;
          uVar9 = ~uVar8 + uVar10;
          uVar10 = uVar8;
          if ((puVar12 + uVar8 + 1)[-1] < uVar5) {
            puVar12 = puVar12 + uVar8 + 1;
            uVar10 = uVar9;
          }
        }
      }
      if ((puVar12 == puVar11) || (uVar7 == uVar2)) break;
    }
    if (uVar4 != 0) {
      if (uVar4 < local_a8) {
        lVar13 = (longdouble)(long)local_a8 + (longdouble)(float)(&DAT_0036e0d8)[(long)local_a8 < 0]
        ;
        lVar14 = ((longdouble)(long)uVar4 + (longdouble)(float)(&DAT_0036e0d8)[(long)uVar4 < 0]) /
                 lVar13;
        lVar16 = lVar15 * lVar15 *
                 ((longdouble)1 - lVar14) *
                 ((longdouble)(long)uVar4 + (longdouble)(float)(&DAT_0036e0d8)[(long)uVar4 < 0]) +
                 lVar16;
        lVar15 = lVar15 * lVar14;
      }
      else {
        lVar13 = (longdouble)(long)local_a8 + (longdouble)(float)(&DAT_0036e0d8)[(long)local_a8 < 0]
        ;
      }
      *x_mean = (double)lVar15;
      dVar17 = (double)SQRT(lVar16 / lVar13);
      goto LAB_0023ef5c;
    }
  }
  *x_mean = 0.0;
  dVar17 = 0.0;
LAB_0023ef5c:
  *x_sd = dVar17;
  return;
}

Assistant:

void calc_mean_and_sd_(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                      double &restrict x_sd, double &restrict x_mean)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    size_t cnt = end - st + 1;
    size_t added = 0;
    real_t m = 0;
    real_t s = 0;
    real_t m_prev = 0;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt--;
            }

            else
            {
                if (added == 0) m_prev = Xc[curr_pos];
                m += (Xc[curr_pos] - m) / (real_t)(++added);
                s  = std::fma(Xc[curr_pos] - m, Xc[curr_pos] - m_prev, s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * ((real_t)added * ((real_t)1 - (real_t)added/(real_t)cnt));
        m *= (real_t)added / (real_t)cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (real_t)cnt);
}